

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O0

VertexData<Vertex> * __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::separateNonmanifoldVertices
          (ManifoldSurfaceMesh *this)

{
  Vertex e;
  undefined1 uVar1;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *in_RSI;
  ParentMeshT *in_RDI;
  Etype EVar2;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  VertexData<Vertex> *parents;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> *in_stack_ffffffffffffff28;
  SurfaceMesh *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff48;
  ParentMeshT *pPVar3;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  pPVar3 = in_RDI;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
            (in_RSI,in_RDI);
  SurfaceMesh::vertices(in_stack_ffffffffffffff30);
  local_20 = local_38;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff30);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff30);
  while (uVar1 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                           ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                            in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), (bool)uVar1) {
    EVar2 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x206da8);
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh.
    _7_1_ = uVar1;
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh.
    _0_7_ = in_stack_ffffffffffffff48;
    e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_RDI;
    in_stack_ffffffffffffff30 =
         (SurfaceMesh *)
         MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::operator[]
                   ((MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *)
                    EVar2.
                    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                    .mesh,e);
    in_stack_ffffffffffffff30->_vptr_SurfaceMesh =
         (_func_int **)
         EVar2.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
    ;
    (in_stack_ffffffffffffff30->vertexExpandCallbackList).
    super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         EVar2.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_ffffffffffffff30);
  }
  return (VertexData<Vertex> *)pPVar3;
}

Assistant:

VertexData<Vertex> ManifoldSurfaceMesh::separateNonmanifoldVertices() {
  VertexData<Vertex> parents(*this);
  for (Vertex v : vertices()) parents[v] = v;
  return parents;
}